

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emfile.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  FILE *__stream;
  long lVar5;
  undefined8 uStack_fd0;
  int socks [1000];
  
  lVar5 = -1;
  do {
    if (lVar5 == 999) {
LAB_00101221:
      do {
        if (lVar5 == -1) {
          return 0;
        }
        iVar2 = nn_close(socks[lVar5]);
        __stream = _stderr;
        lVar5 = lVar5 + -1;
      } while (iVar2 == 0);
      puVar3 = (uint *)__errno_location();
      pcVar4 = nn_err_strerror(*puVar3);
      uVar1 = *puVar3;
      uStack_fd0 = 0x31;
LAB_00101263:
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar4,(ulong)uVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/emfile.c"
              ,uStack_fd0);
      fflush(_stderr);
      nn_err_abort();
    }
    iVar2 = nn_socket(1,0x10);
    socks[lVar5 + 1] = iVar2;
    if (iVar2 < 0) {
      iVar2 = nn_errno();
      __stream = _stderr;
      if (iVar2 != 0x18) {
        puVar3 = (uint *)__errno_location();
        pcVar4 = nn_err_strerror(*puVar3);
        uVar1 = *puVar3;
        uStack_fd0 = 0x28;
        goto LAB_00101263;
      }
      goto LAB_00101221;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

int main ()
{
    int rc;
    int i;
    int socks [MAX_SOCKETS];

    /*  First, just create as much SP sockets as possible. */
    for (i = 0; i != MAX_SOCKETS; ++i) {
        socks [i] = nn_socket (AF_SP, NN_PAIR);
        if (socks [i] < 0) {
            errno_assert (nn_errno () == EMFILE);
            break;
        }
    }
    while (1) {
        --i;
        if (i == -1)
            break;
        rc = nn_close (socks [i]);
        errno_assert (rc == 0);
    }

    return 0;
}